

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexical.cpp
# Opt level: O1

bool fs_is_prefix(string_view prefix,string_view path)

{
  size_type sVar1;
  int iVar2;
  bool bVar3;
  string pr;
  string p;
  string local_78;
  string local_58;
  long *local_38;
  size_t local_30;
  long local_28 [2];
  
  if (path._M_len != 0 && prefix._M_len != 0) {
    fs_drop_slash_abi_cxx11_(&local_78,prefix);
    fs_drop_slash_abi_cxx11_(&local_58,path);
    sVar1 = local_78._M_string_length;
    if ((local_78._M_string_length != local_58._M_string_length) ||
       ((bVar3 = true, local_78._M_string_length != 0 &&
        (iVar2 = bcmp(local_78._M_dataplus._M_p,local_58._M_dataplus._M_p,local_78._M_string_length)
        , iVar2 != 0)))) {
      if (local_58._M_string_length < sVar1) {
        bVar3 = false;
      }
      else {
        std::__cxx11::string::substr((ulong)&local_38,(ulong)&local_58);
        if (local_30 == local_78._M_string_length) {
          if (local_30 == 0) {
            bVar3 = true;
          }
          else {
            iVar2 = bcmp(local_38,local_78._M_dataplus._M_p,local_30);
            bVar3 = iVar2 == 0;
          }
        }
        else {
          bVar3 = false;
        }
        if (local_38 != local_28) {
          operator_delete(local_38,local_28[0] + 1);
        }
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    return bVar3;
  }
  return false;
}

Assistant:

bool
fs_is_prefix(std::string_view prefix, std::string_view path)
{
  // is prefix a prefix of path. Does not normalize, canonicalize, or walk up the directory tree.
  // ".." is ambiguous and should be avoided in input

  if(prefix.empty() || path.empty())
    return false;

  std::string const pr = fs_drop_slash(prefix);
  std::string const p = fs_drop_slash(path);

  if (pr == p)
    return true;

  if (pr.size() > p.size())
    return false;

#ifdef __cpp_lib_starts_ends_with  // C++20
  return p.starts_with(pr);
#else
  return p.substr(0, pr.size()) == pr;
#endif

}